

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveDataTypeTest_Test::TestBody
          (OpenDDLParserTest_parsePrimitiveDataTypeTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_6;
  Message local_150;
  ValueType local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  char *end2;
  char invalidToken [5];
  size_t len2;
  Message local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  Message local_e8;
  ValueType local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  char *end1;
  char token1 [6];
  size_t len1;
  Message local_a8;
  undefined4 local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  ValueType local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  char *in;
  size_t len;
  OpenDDLParserTest_parsePrimitiveDataTypeTest_Test *pOStack_10;
  ValueType type;
  OpenDDLParserTest_parsePrimitiveDataTypeTest_Test *this_local;
  
  in = (char *)0x0;
  pOStack_10 = this;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::parsePrimitiveDataType
                 ((char *)0x0,(char *)0x0,(ValueType *)((long)&len + 4),(size_t *)&in);
  testing::internal::EqHelper<true>::Compare<char>
            ((EqHelper<true> *)local_38,"nullptr","in",(Secret *)0x0,(char *)gtest_ar.message_.ptr_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_74 = ddl_none;
    testing::internal::EqHelper<false>::
    Compare<ODDLParser::Value::ValueType,ODDLParser::Value::ValueType>
              ((EqHelper<false> *)local_70,"Value::ValueType::ddl_none","type",&local_74,
               (ValueType *)((long)&len + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x130,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    local_9c = 0;
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              ((char *)local_98,"0U",(uint *)0x1a408d,(unsigned_long *)&local_9c,&in);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x131,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len1,&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len1);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    _token1 = 0;
    end1._4_2_ = 0x74;
    end1._0_4_ = 0x616f6c66;
    gtest_ar_3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         findEnd((char *)&end1,(size_t *)token1);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OpenDDLParser::parsePrimitiveDataType
                   ((char *)&end1,(char *)gtest_ar_3.message_.ptr_,(ValueType *)((long)&len + 4),
                    (size_t *)&in);
    local_dc = ddl_float;
    testing::internal::EqHelper<false>::
    Compare<ODDLParser::Value::ValueType,ODDLParser::Value::ValueType>
              ((EqHelper<false> *)local_d8,"Value::ValueType::ddl_float","type",&local_dc,
               (ValueType *)((long)&len + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x136,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    local_104 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_100,"1U","len",&local_104,(unsigned_long *)&in);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x137,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len2,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len2);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    _invalidToken = 0;
    end2._4_1_ = 0;
    end2._0_4_ = 0x74616f66;
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         findEnd((char *)&end1,(size_t *)invalidToken);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OpenDDLParser::parsePrimitiveDataType
                   ((char *)&end2,(char *)gtest_ar_5.message_.ptr_,(ValueType *)((long)&len + 4),
                    (size_t *)&in);
    local_144 = ddl_none;
    testing::internal::EqHelper<false>::
    Compare<ODDLParser::Value::ValueType,ODDLParser::Value::ValueType>
              ((EqHelper<false> *)local_140,"Value::ValueType::ddl_none","type",&local_144,
               (ValueType *)((long)&len + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x13c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    local_16c = 0;
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              ((char *)local_168,"0U",(uint *)0x1a408d,(unsigned_long *)&local_16c,&in);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x13d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveDataTypeTest) {
    Value::ValueType type;
    size_t len(0);
    char *in = OpenDDLParser::parsePrimitiveDataType(nullptr, nullptr, type, len);
    ASSERT_EQ(nullptr, in);
    EXPECT_EQ(Value::ValueType::ddl_none, type);
    EXPECT_EQ(0U, len);

    size_t len1(0);
    char token1[] = "float", *end1(findEnd(token1, len1));
    in = OpenDDLParser::parsePrimitiveDataType(token1, end1, type, len);
    EXPECT_EQ(Value::ValueType::ddl_float, type);
    EXPECT_EQ(1U, len);

    size_t len2(0);
    char invalidToken[] = "foat", *end2(findEnd(token1, len2));
    in = OpenDDLParser::parsePrimitiveDataType(invalidToken, end2, type, len);
    EXPECT_EQ(Value::ValueType::ddl_none, type);
    EXPECT_EQ(0U, len);
}